

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

RSA * RSA_public_key_from_bytes(uint8_t *in,size_t in_len)

{
  size_t sVar1;
  RSA *ret;
  CBS cbs;
  size_t in_len_local;
  uint8_t *in_local;
  
  cbs.len = in_len;
  CBS_init((CBS *)&ret,in,in_len);
  in_local = (uint8_t *)RSA_parse_public_key((CBS *)&ret);
  if (((RSA *)in_local == (RSA *)0x0) || (sVar1 = CBS_len((CBS *)&ret), sVar1 != 0)) {
    ERR_put_error(4,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                  ,0x4e);
    RSA_free((RSA *)in_local);
    in_local = (uint8_t *)0x0;
  }
  return (RSA *)in_local;
}

Assistant:

RSA *RSA_public_key_from_bytes(const uint8_t *in, size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  RSA *ret = RSA_parse_public_key(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    RSA_free(ret);
    return NULL;
  }
  return ret;
}